

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_containers.cc
# Opt level: O2

void __thiscall
containers_surjection_contains_key_Test::TestBody(containers_surjection_contains_key_Test *this)

{
  return;
}

Assistant:

TEST(containers_surjection, contains_key) {

    static_assert(S0::contains_key<std::integral_constant<int, 0>>::value, "");
    static_assert(S0::contains_key<std::integral_constant<int, 1>>::value, "");
    static_assert(S0::contains_key<std::integral_constant<int, 2>>::value, "");
    static_assert(S0::contains_key<std::integral_constant<int, 3>>::value, "");
    static_assert(S0::contains_key<std::integral_constant<int, 4>>::value, "");
    static_assert(!S0::contains_key<std::integral_constant<int, 5>>::value, "");

    static_assert(S1::contains_key<std::integral_constant<int, 0>>::value, "");
    static_assert(S1::contains_key<std::integral_constant<int, 1>>::value, "");
    static_assert(S1::contains_key<std::integral_constant<int, 2>>::value, "");
    static_assert(S1::contains_key<std::integral_constant<int, 3>>::value, "");
    static_assert(S1::contains_key<std::integral_constant<int, 4>>::value, "");
    static_assert(!S1::contains_key<std::integral_constant<int, 5>>::value, "");
}